

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

void Js::JavascriptLibrary::CheckRegisteredBuiltIns(Type *builtInFuncs,ScriptContext *scriptContext)

{
  code *pcVar1;
  _E _Var2;
  _E _Var3;
  LocalFunctionId localFuncId;
  JavascriptFunction **ppJVar4;
  JavascriptFunction *this;
  FunctionInfo *this_00;
  undefined4 *puVar5;
  bool bVar6;
  BuiltinFunction local_1b;
  _E local_1a;
  _E local_19;
  byte index;
  ScriptContext *pSStack_18;
  byte count;
  ScriptContext *scriptContext_local;
  Type *builtInFuncs_local;
  
  local_19 = Count;
  local_1a = Math_Abs;
  pSStack_18 = scriptContext;
  scriptContext_local = (ScriptContext *)builtInFuncs;
  do {
    if (local_19 <= local_1a) {
      return;
    }
    ppJVar4 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptFunction__
                        ((WriteBarrierPtr *)
                         (&scriptContext_local->super_ScriptContextInfo + local_1a));
    _Var2 = local_1a;
    bVar6 = true;
    if (*ppJVar4 != (JavascriptFunction *)0x0) {
      this = Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator->
                       ((WriteBarrierPtr<Js::JavascriptFunction> *)
                        (&scriptContext_local->super_ScriptContextInfo + local_1a));
      this_00 = JavascriptFunction::GetFunctionInfo(this);
      localFuncId = FunctionInfo::GetLocalFunctionId(this_00);
      local_1b = GetBuiltInForFuncInfo(localFuncId);
      _Var3 = BuiltinFunction::operator_cast_to__E(&local_1b);
      bVar6 = _Var2 == _Var3;
    }
    if (!bVar6) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                  ,0xf32,
                                  "(!builtInFuncs[index] || (index == GetBuiltInForFuncInfo(builtInFuncs[index]->GetFunctionInfo()->GetLocalFunctionId())))"
                                  ,
                                  "!builtInFuncs[index] || (index == GetBuiltInForFuncInfo(builtInFuncs[index]->GetFunctionInfo()->GetLocalFunctionId()))"
                                 );
      if (!bVar6) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    local_1a = local_1a + Math_Acos;
  } while( true );
}

Assistant:

void JavascriptLibrary::CheckRegisteredBuiltIns(
        Field(JavascriptFunction*)* builtInFuncs, ScriptContext *scriptContext)
    {
        byte count = BuiltinFunction::Count;
        for (byte index = 0; index < count; index++)
        {
            Assert(!builtInFuncs[index] || (index == GetBuiltInForFuncInfo(builtInFuncs[index]->GetFunctionInfo()->GetLocalFunctionId())));
        }
    }